

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetresizehandler.cpp
# Opt level: O3

void __thiscall
QWidgetResizeHandler::QWidgetResizeHandler(QWidgetResizeHandler *this,QWidget *parent,QWidget *cw)

{
  int iVar1;
  QFrame *this_00;
  int iVar2;
  
  QObject::QObject((QObject *)this,&parent->super_QObject);
  *(undefined ***)this = &PTR_metaObject_007f86c8;
  *(QWidget **)(this + 0x10) = parent;
  if (cw == (QWidget *)0x0) {
    cw = parent;
  }
  *(QWidget **)(this + 0x18) = cw;
  *(undefined4 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] & 0xfc);
  *(undefined8 *)(this + 0x30) = 0;
  QWidget::setAttribute(parent,WA_MouseTracking,true);
  this_00 = (QFrame *)QMetaObject::cast((QObject *)&QFrame::staticMetaObject);
  if (this_00 == (QFrame *)0x0) {
    iVar2 = 4;
  }
  else {
    iVar1 = QFrame::frameWidth(this_00);
    iVar2 = 4;
    if (4 < iVar1) {
      iVar2 = iVar1;
    }
  }
  *(int *)(this + 0x3c) = iVar2;
  this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] | 4);
  QObject::installEventFilter(*(QObject **)(this + 0x10));
  return;
}

Assistant:

QWidgetResizeHandler::QWidgetResizeHandler(QWidget *parent, QWidget *cw)
    : QObject(parent), widget(parent), childWidget(cw ? cw : parent),
      fw(0), extrahei(0), buttonDown(false), active(false)
{
    mode = Nowhere;
    widget->setMouseTracking(true);
    QFrame *frame = qobject_cast<QFrame*>(widget);
    range = frame ? frame->frameWidth() : RANGE;
    range = qMax(RANGE, range);
    enabled = true;
    widget->installEventFilter(this);
}